

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeReadIOCallback.cpp
# Opt level: O3

void __thiscall
libebml::SafeReadIOCallback::SafeReadIOCallback(SafeReadIOCallback *this,EbmlBinary *Binary)

{
  int iVar1;
  int iVar2;
  MemReadIOCallback *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = (MemReadIOCallback *)operator_new(0x20);
  MemReadIOCallback::MemReadIOCallback(this_00,Binary);
  this->mIO = (IOCallback *)this_00;
  this->mDeleteIO = true;
  iVar1 = (*(this_00->super_IOCallback)._vptr_IOCallback[5])(this_00);
  (*(this_00->super_IOCallback)._vptr_IOCallback[3])(this_00,0,2);
  iVar2 = (*(this_00->super_IOCallback)._vptr_IOCallback[5])(this_00);
  this->mSize = CONCAT44(extraout_var_00,iVar2);
  (*(this_00->super_IOCallback)._vptr_IOCallback[3])(this_00,CONCAT44(extraout_var,iVar1),0);
  return;
}

Assistant:

SafeReadIOCallback::SafeReadIOCallback(EbmlBinary const &Binary) {
  Init(new MemReadIOCallback(Binary), true);
}